

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

uint * fetchRGBToRGB32<(QImage::Format)29>
                 (uint *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
                 QDitherInfo *param_6)

{
  uint uVar1;
  byte *pbVar2;
  ulong uVar3;
  
  if ((_qt_cpu_features & 4) == 0) {
    if (0 < count) {
      pbVar2 = src + (long)index * 3 + 2;
      uVar3 = 0;
      do {
        buffer[uVar3] =
             (uint)*pbVar2 << 0x10 | (uint)pbVar2[-2] | (uint)pbVar2[-1] << 8 | 0xff000000;
        uVar3 = uVar3 + 1;
        pbVar2 = pbVar2 + 3;
      } while ((uint)count != uVar3);
    }
  }
  else {
    fetchPixelsBPP24_ssse3(buffer,src,index,count);
    if (0 < count) {
      uVar3 = 0;
      do {
        uVar1 = buffer[uVar3];
        buffer[uVar3] = uVar1 & 0xff00 | uVar1 << 0x10 | uVar1 >> 0x10 & 0xff | 0xff000000;
        uVar3 = uVar3 + 1;
      } while ((uint)count != uVar3);
    }
  }
  return buffer;
}

Assistant:

static const uint *QT_FASTCALL fetchRGBToRGB32(uint *buffer, const uchar *src, int index, int count,
                                               const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP BPP = bitsPerPixel<Format>();
#if defined(__SSE2__) && !defined(__SSSE3__) && QT_COMPILER_SUPPORTS_SSSE3
    if (BPP == QPixelLayout::BPP24 && qCpuHasFeature(SSSE3)) {
        // With SSE2 can convertToRGB32 be vectorized, but it takes SSSE3
        // to vectorize the deforested version below.
        fetchPixelsBPP24_ssse3(buffer, src, index, count);
        convertToRGB32<Format>(buffer, count, nullptr);
        return buffer;
    }
#elif defined QT_COMPILER_SUPPORTS_LSX
    if (BPP == QPixelLayout::BPP24 && qCpuHasFeature(LSX)) {
        fetchPixelsBPP24_lsx(buffer, src, index, count);
        convertToRGB32<Format>(buffer, count, nullptr);
        return buffer;
    }
#endif
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32<Format>(fetchPixel<BPP>(src, index + i));
    return buffer;
}